

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O1

MultiIndexSet *
TasGrid::makeSequenceSet
          (MultiIndexSet *__return_storage_ptr__,int cnum_dimensions,int depth,TypeDepth type,
          TypeOneDRule crule,vector<int,_std::allocator<int>_> *anisotropic_weights,
          vector<int,_std::allocator<int>_> *level_limits)

{
  byte bVar1;
  TypeOneDRule local_5c;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  bVar1 = (byte)(0x12a0 >> ((byte)type & 0x1f)) & type < (type_qptensor|type_level);
  local_5c = crule;
  if (bVar1 == 1) {
    local_38._8_8_ = 0;
    local_38._M_unused._M_object = &local_5c;
    pcStack_20 = std::
                 _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:64:48)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:64:48)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,(long)cnum_dimensions,depth,type,
               (function<int_(int)> *)&local_38,anisotropic_weights,level_limits);
  }
  else {
    local_58._M_unused._M_object = (void *)0x0;
    local_58._8_8_ = 0;
    local_40 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:67:48)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/SparseGrids/tsgGridSequence.cpp:67:48)>
               ::_M_manager;
    MultiIndexManipulations::selectTensors
              (__return_storage_ptr__,(long)cnum_dimensions,depth,type,
               (function<int_(int)> *)&local_58,anisotropic_weights,level_limits);
  }
  if (bVar1 == 0) {
    if (local_48 != (code *)0x0) {
      (*local_48)((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
    }
  }
  else if (local_28 != (code *)0x0) {
    (*local_28)((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

inline MultiIndexSet makeSequenceSet(int cnum_dimensions, int depth, TypeDepth type, TypeOneDRule crule,
                                     const std::vector<int> &anisotropic_weights, const std::vector<int> &level_limits){
    return (OneDimensionalMeta::isExactQuadrature(type)) ?
        MultiIndexManipulations::selectTensors((size_t) cnum_dimensions, depth, type,
                                               [&](int i) -> int{ return OneDimensionalMeta::getQExact(i, crule); },
                                               anisotropic_weights, level_limits) :
        MultiIndexManipulations::selectTensors((size_t) cnum_dimensions, depth, type,
                                               [&](int i) -> int{ return i; }, anisotropic_weights, level_limits);
}